

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1be885c::Impl::EventHandlers::~EventHandlers(EventHandlers *this)

{
  EventHandlers *this_local;
  
  std::
  unordered_map<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_dap::Error_*)>,_std::hash<const_dap::TypeInfo_*>,_std::equal_to<const_dap::TypeInfo_*>,_std::allocator<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>_>_>
  ::~unordered_map(&this->responseSentMap);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*)>_>_>_>_>
  ::~unordered_map(&this->eventMap);
  std::
  unordered_map<long,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_dap::Error_*)>_>_>_>_>
  ::~unordered_map(&this->responseMap);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&)>_>_>_>_>
  ::~unordered_map(&this->requestMap);
  std::function<void_(const_char_*)>::~function(&this->errorHandler);
  return;
}

Assistant:

void put(const ErrorHandler& handler) {
      std::unique_lock<std::mutex> lock(errorMutex);
      errorHandler = handler;
    }